

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<bool,unique_ptr<Struct2>>
          (internal *this,char *lhs_expression,char *rhs_expression,bool *lhs,
          unique_ptr<Struct2> *rhs)

{
  bool *pbVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar2;
  unique_ptr<Struct2> *rhs_local;
  bool *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = lhs;
  FormatForComparisonFailureMessage<bool,unique_ptr<Struct2>>
            (&local_30,(internal *)lhs,(bool *)rhs,(unique_ptr<Struct2> *)lhs);
  FormatForComparisonFailureMessage<unique_ptr<Struct2>,bool>
            (&local_50,(internal *)rhs,(unique_ptr<Struct2> *)lhs,pbVar1);
  EqFailure(this,lhs_expression,rhs_expression,&local_30,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar2.message_.ptr_ = extraout_RDX.ptr_;
    AVar2._0_8_ = this;
    return AVar2;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}